

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Add<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
          (RepeatedPtrFieldBase *this,Type *prototype)

{
  int iVar1;
  Arena *this_00;
  Rep *pRVar2;
  DescriptorProto *this_01;
  int iVar3;
  
  pRVar2 = this->rep_;
  if (pRVar2 == (Rep *)0x0) {
    iVar3 = this->total_size_;
  }
  else {
    iVar1 = this->current_size_;
    iVar3 = pRVar2->allocated_size;
    if (iVar1 < iVar3) {
      this->current_size_ = iVar1 + 1;
      return (Type *)pRVar2->elements[iVar1];
    }
    if (iVar3 != this->total_size_) goto LAB_00209a8b;
  }
  Reserve(this,iVar3 + 1);
  pRVar2 = this->rep_;
  iVar3 = pRVar2->allocated_size;
LAB_00209a8b:
  pRVar2->allocated_size = iVar3 + 1;
  this_00 = this->arena_;
  if (this_00 == (Arena *)0x0) {
    this_01 = (DescriptorProto *)operator_new(0xe8);
    DescriptorProto::DescriptorProto(this_01);
  }
  else {
    this_01 = (DescriptorProto *)
              Arena::AllocateAligned(this_00,(type_info *)&DescriptorProto::typeinfo,0xe8);
    DescriptorProto::DescriptorProto(this_01);
    Arena::AddListNode(this_00,this_01,arena_destruct_object<google::protobuf::DescriptorProto>);
  }
  iVar3 = this->current_size_;
  this->current_size_ = iVar3 + 1;
  this->rep_->elements[iVar3] = this_01;
  return this_01;
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::Add(
    typename TypeHandler::Type* prototype) {
  if (rep_ != NULL && current_size_ < rep_->allocated_size) {
    return cast<TypeHandler>(rep_->elements[current_size_++]);
  }
  if (!rep_ || rep_->allocated_size == total_size_) {
    Reserve(total_size_ + 1);
  }
  ++rep_->allocated_size;
  typename TypeHandler::Type* result =
      TypeHandler::NewFromPrototype(prototype, arena_);
  rep_->elements[current_size_++] = result;
  return result;
}